

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *os,SelectionSet *ss)

{
  ostream *poVar1;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RSI;
  ostream *in_RDI;
  int i;
  OpenMDBitSet *in_stack_00000048;
  ostream *in_stack_00000050;
  int local_14;
  
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    poVar1 = std::operator<<(in_RDI,"SelectionSet[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
    std::operator<<(poVar1,"] = ");
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RSI,(long)local_14);
    poVar1 = operator<<(in_stack_00000050,in_stack_00000048);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SelectionSet& ss) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      os << "SelectionSet[" << i << "] = " << ss.bitsets_[i] << std::endl;
    return os;
  }